

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::updateArpeggio(MIDIplay *this,double param_1)

{
  ushort uVar1;
  uint uVar2;
  OPL3 *pOVar3;
  reference pAVar4;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar5;
  reference pMVar6;
  notes_iterator nVar7;
  LocationData *pLVar8;
  LocationData *d;
  size_t n;
  size_t count;
  size_t rate_reduction;
  users_iterator i;
  size_t n_users;
  uint32_t c;
  Synth *synth;
  double param_1_local;
  MIDIplay *this_local;
  
  pOVar3 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
  if (((this->m_setup).enableAutoArpeggio & 1U) == 0) {
    if (this->m_arpeggioCounter != 0) {
      this->m_arpeggioCounter = 0;
    }
  }
  else {
    this->m_arpeggioCounter = this->m_arpeggioCounter + 1;
    for (n_users._4_4_ = 0; n_users._4_4_ < pOVar3->m_numChannels; n_users._4_4_ = n_users._4_4_ + 1
        ) {
      while( true ) {
        uVar2 = std::numeric_limits<int>::max();
        if (uVar2 < n_users._4_4_) {
          return;
        }
        pAVar4 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                 operator[](&this->m_chipChannels,(ulong)n_users._4_4_);
        i.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)
                  pl_list<MIDIplay::AdlChannel::LocationData>::size(&pAVar4->users);
        if (i.cell_ < (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x2) goto LAB_0016faff;
        pAVar4 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::
                 operator[](&this->m_chipChannels,(ulong)n_users._4_4_);
        rate_reduction = (size_t)pl_list<MIDIplay::AdlChannel::LocationData>::begin(&pAVar4->users);
        count = 3;
        if ((pl_cell<MIDIplay::AdlChannel::LocationData> *)0x2 < i.cell_) {
          count = 2;
        }
        if ((pl_cell<MIDIplay::AdlChannel::LocationData> *)0x3 < i.cell_) {
          count = 1;
        }
        pLVar8 = (LocationData *)((this->m_arpeggioCounter / count) % (ulong)i.cell_);
        for (d = (LocationData *)0x0; d < pLVar8; d = (LocationData *)((long)&(d->loc).MidCh + 1)) {
          pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator++
                    ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&rate_reduction);
        }
        ppVar5 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                           ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)
                            &rate_reduction);
        pLVar8 = &ppVar5->value;
        if ((ppVar5->value).sustained != 0) goto LAB_0016faff;
        if (0 < (ppVar5->value).kon_time_until_neglible_us) break;
        uVar1 = (pLVar8->loc).MidCh;
        pMVar6 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
                 operator[](&this->m_midiChannels,(ulong)(pLVar8->loc).MidCh);
        nVar7 = MIDIchannel::ensure_find_activenote(pMVar6,(uint)(ppVar5->value).loc.note);
        noteUpdate(this,(ulong)uVar1,nVar7,0x20,n_users._4_4_);
      }
      uVar1 = (pLVar8->loc).MidCh;
      pMVar6 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)(pLVar8->loc).MidCh);
      nVar7 = MIDIchannel::ensure_find_activenote(pMVar6,(uint)(ppVar5->value).loc.note);
      noteUpdate(this,(ulong)uVar1,nVar7,0xe,n_users._4_4_);
LAB_0016faff:
    }
  }
  return;
}

Assistant:

void MIDIplay::updateArpeggio(double) // amount = amount of time passed
{
    // If there is an adlib channel that has multiple notes
    // simulated on the same channel, arpeggio them.

    Synth &synth = *m_synth;

    if(!m_setup.enableAutoArpeggio) // Arpeggio was disabled
    {
        if(m_arpeggioCounter != 0)
            m_arpeggioCounter = 0;
        return;
    }

#if 0
    const unsigned desired_arpeggio_rate = 40; // Hz (upper limit)
#   if 1
    static unsigned cache = 0;
    amount = amount; // Ignore amount. Assume we get a constant rate.
    cache += MaxSamplesAtTime * desired_arpeggio_rate;

    if(cache < PCM_RATE) return;

    cache %= PCM_RATE;
#   else
    static double arpeggio_cache = 0;
    arpeggio_cache += amount * desired_arpeggio_rate;

    if(arpeggio_cache < 1.0) return;

    arpeggio_cache = 0.0;
#   endif
#endif

    ++m_arpeggioCounter;

    for(uint32_t c = 0; c < synth.m_numChannels; ++c)
    {
retry_arpeggio:
        if(c > uint32_t(std::numeric_limits<int32_t>::max()))
            break;

        size_t n_users = m_chipChannels[c].users.size();

        if(n_users > 1)
        {
            AdlChannel::users_iterator i = m_chipChannels[c].users.begin();
            size_t rate_reduction = 3;

            if(n_users >= 3)
                rate_reduction = 2;

            if(n_users >= 4)
                rate_reduction = 1;

            for(size_t count = (m_arpeggioCounter / rate_reduction) % n_users,
                n = 0; n < count; ++n)
                ++i;

            AdlChannel::LocationData &d = i->value;
            if(d.sustained == AdlChannel::LocationData::Sustain_None)
            {
                if(d.kon_time_until_neglible_us <= 0)
                {
                    noteUpdate(
                        d.loc.MidCh,
                        m_midiChannels[ d.loc.MidCh ].ensure_find_activenote(d.loc.note),
                        Upd_Off,
                        static_cast<int32_t>(c));
                    goto retry_arpeggio;
                }

                noteUpdate(
                    d.loc.MidCh,
                    m_midiChannels[ d.loc.MidCh ].ensure_find_activenote(d.loc.note),
                    Upd_Pitch | Upd_Volume | Upd_Pan,
                    static_cast<int32_t>(c));
            }
        }
    }
}